

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_timeout.c
# Opt level: O0

void ares_timeval_remaining(ares_timeval_t *remaining,ares_timeval_t *now,ares_timeval_t *tout)

{
  ares_timeval_t *tout_local;
  ares_timeval_t *now_local;
  ares_timeval_t *remaining_local;
  
  memset(remaining,0,0x10);
  if ((now->sec <= tout->sec) && ((tout->sec != now->sec || (now->usec <= tout->usec)))) {
    remaining->sec = tout->sec - now->sec;
    if (tout->usec < now->usec) {
      remaining->sec = remaining->sec + -1;
      remaining->usec = (tout->usec + 1000000) - now->usec;
    }
    else {
      remaining->usec = tout->usec - now->usec;
    }
  }
  return;
}

Assistant:

void ares_timeval_remaining(ares_timeval_t       *remaining,
                            const ares_timeval_t *now,
                            const ares_timeval_t *tout)
{
  memset(remaining, 0, sizeof(*remaining));

  /* Expired! */
  if (tout->sec < now->sec ||
      (tout->sec == now->sec && tout->usec < now->usec)) {
    return;
  }

  remaining->sec = tout->sec - now->sec;
  if (tout->usec < now->usec) {
    remaining->sec  -= 1;
    remaining->usec  = (tout->usec + 1000000) - now->usec;
  } else {
    remaining->usec = tout->usec - now->usec;
  }
}